

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::applyResetPragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  bool bVar1;
  SyntaxNode *this_00;
  Diagnostic *this_01;
  SourceRange range;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_108;
  size_t local_f8;
  char *local_f0;
  size_t local_e8;
  size_t local_e0;
  SourceRange local_d8;
  DiagCode local_c4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c0;
  size_t local_b0;
  char *local_a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a0;
  size_t local_90;
  char *local_88;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_80;
  size_t local_70;
  char *local_68;
  undefined1 local_60 [8];
  string_view name;
  SimplePragmaExpressionSyntax *simple;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  PragmaDirectiveSyntax *pragma_local;
  Preprocessor *this_local;
  
  join_0x00000010_0x00000000_ =
       slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
                 (&pragma->args);
  _arg = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
                   (&pragma->args);
  while (bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                 ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                               *)&__end2.index,
                              (iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)&arg),
        bVar1) {
    this_00 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
               iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*
                         ((iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)
                          &__end2.index)->super_SyntaxNode;
    if ((this_00->kind == SimplePragmaExpression) &&
       (name._M_str = (char *)slang::syntax::SyntaxNode::
                              as<slang::syntax::SimplePragmaExpressionSyntax>(this_00),
       (((SimplePragmaExpressionSyntax *)name._M_str)->value).kind == Identifier)) {
      _local_60 = Token::rawText(&((SimplePragmaExpressionSyntax *)name._M_str)->value);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
      if (!bVar1) {
        local_70 = (size_t)local_60;
        local_68 = (char *)name._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_80,"protect");
        __x_02._M_str = local_68;
        __x_02._M_len = local_70;
        bVar1 = std::operator!=(__x_02,local_80);
        if (bVar1) {
          local_90 = (size_t)local_60;
          local_88 = (char *)name._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"once")
          ;
          __x_01._M_str = local_88;
          __x_01._M_len = local_90;
          bVar1 = std::operator!=(__x_01,local_a0);
          if (bVar1) {
            local_b0 = (size_t)local_60;
            local_a8 = (char *)name._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_c0,"diagnostic");
            __x_00._M_str = local_a8;
            __x_00._M_len = local_b0;
            bVar1 = std::operator!=(__x_00,local_c0);
            if (bVar1) {
              local_c4.subsystem = Preprocessor;
              local_c4.code = 0x2b;
              local_d8 = Token::range((Token *)(name._M_str + 0x10));
              this_01 = addDiag(this,local_c4,local_d8);
              local_e8 = (size_t)local_60;
              local_e0 = name._M_len;
              Diagnostic::operator<<(this_01,_local_60);
            }
          }
        }
      }
      local_f8 = (size_t)local_60;
      local_f0 = (char *)name._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"protect")
      ;
      __x._M_str = local_f0;
      __x._M_len = local_f8;
      bVar1 = std::operator==(__x,local_108);
      if (bVar1) {
        resetProtectState(this);
      }
    }
    else {
      range = slang::syntax::SyntaxNode::sourceRange(this_00);
      addDiag(this,(DiagCode)0x90004,range);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

void Preprocessor::applyResetPragma(const PragmaDirectiveSyntax& pragma) {
    // Just check that we know about the names being reset, and warn if we don't.
    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier) {
                string_view name = simple.value.rawText();
                if (!name.empty() && name != "protect" && name != "once" && name != "diagnostic")
                    addDiag(diag::UnknownPragma, simple.value.range()) << name;

                if (name == "protect")
                    resetProtectState();

                continue;
            }
        }

        // Otherwise this isn't even a pragma name, so it's ill-formed.
        addDiag(diag::ExpectedPragmaName, arg->sourceRange());
    }
}